

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O3

lu_int basiclu_obj_solve_for_update
                 (basiclu_object *obj,lu_int nzrhs,lu_int *irhs,double *xrhs,char trans,
                 lu_int want_solution)

{
  lu_int lVar1;
  lu_int *p_nzlhs;
  
  lVar1 = -8;
  if (((obj != (basiclu_object *)0x0) && (obj->istore != (lu_int *)0x0)) &&
     (obj->xstore != (double *)0x0)) {
    lu_clear_lhs(obj);
    p_nzlhs = (lu_int *)0x0;
    if (want_solution != 0) {
      p_nzlhs = &obj->nzlhs;
    }
    do {
      lVar1 = basiclu_solve_for_update
                        (obj->istore,obj->xstore,obj->Li,obj->Lx,obj->Ui,obj->Ux,obj->Wi,obj->Wx,
                         nzrhs,irhs,xrhs,p_nzlhs,obj->ilhs,obj->lhs,trans);
      if (lVar1 != 1) {
        return lVar1;
      }
      lVar1 = lu_realloc_obj(obj);
    } while (lVar1 == 0);
  }
  return lVar1;
}

Assistant:

lu_int basiclu_obj_solve_for_update(struct basiclu_object *obj, lu_int nzrhs,
                                    const lu_int irhs[], const double xrhs[],
                                    char trans, lu_int want_solution)
{
    lu_int status = BASICLU_OK;

    if (!isvalid(obj))
        return BASICLU_ERROR_invalid_object;

    lu_clear_lhs(obj);
    while (status == BASICLU_OK)
    {
        status = basiclu_solve_for_update(obj->istore, obj->xstore, obj->Li,
                                          obj->Lx, obj->Ui, obj->Ux, obj->Wi,
                                          obj->Wx, nzrhs, irhs, xrhs,
                                          want_solution ? &obj->nzlhs : NULL,
                                          obj->ilhs, obj->lhs, trans);
        if (status != BASICLU_REALLOCATE)
            break;
        status = lu_realloc_obj(obj);
    }

    return status;
}